

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
initPrograms(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this,
            SourceCollections *programCollection)

{
  SourceCollections *this_00;
  ProgramSources *pPVar1;
  ShaderSource local_c8;
  allocator<char> local_99;
  string local_98;
  ShaderSource local_78;
  allocator<char> local_39;
  string local_38;
  SourceCollections *local_18;
  SourceCollections *programCollection_local;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this_local;
  
  local_18 = programCollection;
  programCollection_local = (SourceCollections *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vert",&local_39);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_38);
  glu::VertexSource::VertexSource((VertexSource *)&local_78,&this->m_vertShaderSource);
  glu::ProgramSources::operator<<(pPVar1,&local_78);
  glu::VertexSource::~VertexSource((VertexSource *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"frag",&local_99);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_98);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_c8,&this->m_fragShaderSource);
  glu::ProgramSources::operator<<(pPVar1,&local_c8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_c8);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  return;
}

Assistant:

void DrawTestCase<T>::initPrograms (vk::SourceCollections& programCollection) const
{
	programCollection.glslSources.add("vert") << glu::VertexSource(m_vertShaderSource);
	programCollection.glslSources.add("frag") << glu::FragmentSource(m_fragShaderSource);
}